

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall Chainstate::ReplayBlocks(Chainstate *this)

{
  int height;
  int *args;
  long lVar1;
  CoinsViews *baseIn;
  Notifications *pNVar2;
  uint256 *puVar3;
  int iVar4;
  bool bVar5;
  DisconnectResult DVar6;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar7;
  size_type sVar8;
  mapped_type *pb;
  pointer puVar9;
  CBlockIndex *pCVar10;
  CBlockIndex *pCVar11;
  CBlockIndex **ppCVar12;
  char *fmt;
  int iVar13;
  pointer puVar14;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  vector<uint256,_std::allocator<uint256>_> hashHeads;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  string local_298;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [32];
  uint32_t local_238 [4];
  undefined1 local_228 [40];
  CCoinsViewCache cache;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock36.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock36.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock36.super_unique_lock);
  puVar7 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                     (&this->m_coins_views,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                      ,0x271,"CoinsDB","m_coins_views");
  baseIn = (puVar7->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
           super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
           super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
  CCoinsViewCache::CCoinsViewCache(&cache,(CCoinsView *)baseIn,false);
  (*(baseIn->m_dbview).super_CCoinsView._vptr_CCoinsView[3])(&hashHeads,baseIn);
  if (hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start ==
      hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar5 = true;
    goto LAB_00400a91;
  }
  if ((long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start == 0x40) {
    pNVar2 = (this->m_chainman->m_options).notifications;
    local_278._0_8_ = local_268;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,anon_var_dwarf_1279a64,anon_var_dwarf_1279a64 + 0x13);
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_258._0_8_ = (CBlockIndex *)(local_258 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,anon_var_dwarf_1279a64,anon_var_dwarf_1279a64 + 0x13);
    }
    else {
      local_298._M_dataplus._M_p = anon_var_dwarf_1279a64;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_298);
    }
    (*pNVar2->_vptr_Notifications[4])(pNVar2,local_278,0,0);
    if ((CBlockIndex *)local_258._0_8_ != (CBlockIndex *)(local_258 + 0x10)) {
      operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
    }
    if ((CBlockIndex *)local_278._0_8_ != (CBlockIndex *)local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
    }
    logging_function_00._M_str = "ReplayBlocks";
    logging_function_00._M_len = 0xc;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x1300,ALL,Info,
               (ConstevalFormatString<0U>)0x80f070);
    sVar8 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(&(this->m_blockman->m_block_index)._M_h,
                    hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if (sVar8 != 0) {
      pb = std::__detail::
           _Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->m_blockman->m_block_index,
                        hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start);
      puVar14 = hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start + 2;
      puVar9 = (pointer)std::
                        __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                  (hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 1,puVar14);
      if (puVar9 == puVar14) {
        iVar13 = 0;
      }
      else {
        sVar8 = std::
                _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::count(&(this->m_blockman->m_block_index)._M_h,
                        hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start + 1);
        if (sVar8 == 0) {
          fmt = "ReplayBlocks(): reorganization from unknown block requested\n";
          iVar13 = 0x130e;
          goto LAB_00400a5f;
        }
        pCVar10 = std::__detail::
                  _Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->m_blockman->m_block_index,
                               hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1);
        pCVar11 = LastCommonAncestor(pCVar10,pb);
        if (pCVar11 == (CBlockIndex *)0x0) {
          __assert_fail("pindexFork != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1313,"bool Chainstate::ReplayBlocks()");
        }
        if (pCVar10 != pCVar11) {
          do {
            if (0 < pCVar10->nHeight) {
              local_228._16_3_ = 0;
              local_228._19_8_ = 0;
              local_228._0_8_ = (pointer)0x0;
              local_228._8_3_ = 0;
              local_228._11_5_ = 0;
              local_238[0] = 0;
              local_238[1] = 0;
              local_238[2] = 0;
              local_238[3] = 0;
              local_258._16_8_ = 0;
              local_258._24_4_ = 0;
              local_258._28_4_ = 0;
              local_258._0_8_ = (CBlockIndex *)0x0;
              local_258._8_8_ = 0;
              local_268._0_8_ = (uint256 *)0x0;
              local_268._8_8_ = (CBlockIndex *)0x0;
              local_278._0_8_ = (CBlockIndex *)0x0;
              local_278._8_8_ = 0;
              bVar5 = ::node::BlockManager::ReadBlockFromDisk
                                (this->m_blockman,(CBlock *)local_278,pCVar10);
              args = &pCVar10->nHeight;
              if (bVar5) {
                puVar3 = pCVar10->phashBlock;
                if (puVar3 == (uint256 *)0x0) goto LAB_00400c72;
                local_2b8 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
                uStack_2b0 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
                local_2a8 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
                uStack_2a0 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18)
                ;
                base_blob<256u>::ToString_abi_cxx11_(&local_298,&local_2b8);
                logging_function_01._M_str = "ReplayBlocks";
                logging_function_01._M_len = 0xc;
                source_file_01._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ;
                source_file_01._M_len = 0x5e;
                LogPrintFormatInternal<std::__cxx11::string,int>
                          (logging_function_01,source_file_01,0x131e,ALL,Info,
                           (ConstevalFormatString<2U>)0x80f16c,&local_298,args);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  local_298.field_2._M_allocated_capacity + 1);
                }
                DVar6 = DisconnectBlock(this,(CBlock *)local_278,pCVar10,&cache);
                if (DVar6 != DISCONNECT_FAILED) {
                  std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             *)local_228);
                  goto LAB_00400760;
                }
                puVar3 = pCVar10->phashBlock;
                if (puVar3 == (uint256 *)0x0) goto LAB_00400c72;
                local_2b8 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
                uStack_2b0 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
                local_2a8 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
                uStack_2a0 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18)
                ;
                base_blob<256u>::ToString_abi_cxx11_(&local_298,&local_2b8);
                logging_function_05._M_str = "ReplayBlocks";
                logging_function_05._M_len = 0xc;
                source_file_05._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ;
                source_file_05._M_len = 0x5e;
                LogPrintFormatInternal<int,std::__cxx11::string>
                          (logging_function_05,source_file_05,0x1321,ALL,Error,
                           (ConstevalFormatString<2U>)0x80f182,args,&local_298);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  local_298.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                puVar3 = pCVar10->phashBlock;
                if (puVar3 == (uint256 *)0x0) goto LAB_00400c72;
                local_2b8 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
                uStack_2b0 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
                local_2a8 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
                uStack_2a0 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18)
                ;
                base_blob<256u>::ToString_abi_cxx11_(&local_298,&local_2b8);
                logging_function_04._M_str = "ReplayBlocks";
                logging_function_04._M_len = 0xc;
                source_file_04._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ;
                source_file_04._M_len = 0x5e;
                LogPrintFormatInternal<int,std::__cxx11::string>
                          (logging_function_04,source_file_04,0x131b,ALL,Error,
                           (ConstevalFormatString<2U>)0x80f130,args,&local_298);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  local_298.field_2._M_allocated_capacity + 1);
                }
              }
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)local_228);
              goto LAB_00400a8a;
            }
LAB_00400760:
            pCVar10 = pCVar10->pprev;
          } while (pCVar10 != pCVar11);
        }
        iVar13 = pCVar11->nHeight;
      }
      height = iVar13 + 1;
      local_2b8 = CONCAT44(local_2b8._4_4_,height);
      if (iVar13 < pb->nHeight) {
        do {
          local_278._0_8_ = CBlockIndex::GetAncestor(pb,height);
          ppCVar12 = inline_assertion_check<true,CBlockIndex_const*>
                               ((CBlockIndex **)local_278,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                ,0x132f,"ReplayBlocks","pindexNew->GetAncestor(nHeight)");
          pCVar10 = *ppCVar12;
          puVar3 = pCVar10->phashBlock;
          if (puVar3 == (uint256 *)0x0) goto LAB_00400c72;
          local_298._M_dataplus._M_p = *(pointer *)(puVar3->super_base_blob<256U>).m_data._M_elems;
          local_298._M_string_length =
               *(size_type *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
          local_298.field_2._M_allocated_capacity =
               *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
          local_298.field_2._8_8_ =
               *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
          base_blob<256u>::ToString_abi_cxx11_((string *)local_278,&local_298);
          logging_function_02._M_str = "ReplayBlocks";
          logging_function_02._M_len = 0xc;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_02._M_len = 0x5e;
          LogPrintFormatInternal<std::__cxx11::string,int>
                    (logging_function_02,source_file_02,0x1331,ALL,Info,
                     (ConstevalFormatString<2U>)0x80f1da,(string *)local_278,(int *)&local_2b8);
          if ((CBlockIndex *)local_278._0_8_ != (CBlockIndex *)local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          pNVar2 = (this->m_chainman->m_options).notifications;
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,anon_var_dwarf_1279a64,anon_var_dwarf_1279a64 + 0x13);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_258._0_8_ = local_258 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_258,anon_var_dwarf_1279a64,anon_var_dwarf_1279a64 + 0x13);
          }
          else {
            local_298._M_dataplus._M_p = anon_var_dwarf_1279a64;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_258,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_298);
          }
          (*pNVar2->_vptr_Notifications[4])
                    (pNVar2,local_278,
                     (ulong)(uint)(int)(((double)((int)local_2b8 - iVar13) * 100.0) /
                                       (double)(pb->nHeight - iVar13)),0);
          if ((CBlockIndex *)local_258._0_8_ != (CBlockIndex *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          if ((CBlockIndex *)local_278._0_8_ != (CBlockIndex *)local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          bVar5 = RollforwardBlock(this,pCVar10,&cache);
          if (!bVar5) goto LAB_00400a8a;
          iVar4 = (int)local_2b8;
          height = (int)local_2b8 + 1;
          local_2b8 = CONCAT44(local_2b8._4_4_,height);
        } while (iVar4 < pb->nHeight);
      }
      puVar3 = pb->phashBlock;
      if (puVar3 == (uint256 *)0x0) {
LAB_00400c72:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_278._0_8_ = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
      local_278._8_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      local_268._0_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_268._8_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      CCoinsViewCache::SetBestBlock(&cache,(uint256 *)local_278);
      CCoinsViewCache::Flush(&cache);
      pNVar2 = (this->m_chainman->m_options).notifications;
      local_278._0_8_ = local_268;
      local_278._8_8_ = 0;
      local_268._0_8_ = local_268._0_8_ & 0xffffffffffffff00;
      local_258._8_8_ = 0;
      local_258._16_8_ = local_258._16_8_ & 0xffffffffffffff00;
      local_258._0_8_ = (CBlockIndex *)(local_258 + 0x10);
      (*pNVar2->_vptr_Notifications[4])(pNVar2,local_278,100,0);
      if ((CBlockIndex *)local_258._0_8_ != (CBlockIndex *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((CBlockIndex *)local_278._0_8_ != (CBlockIndex *)local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
      }
      bVar5 = true;
      goto LAB_00400a91;
    }
    fmt = "ReplayBlocks(): reorganization to unknown block requested\n";
    iVar13 = 0x1307;
LAB_00400a5f:
    logging_function_03._M_str = "ReplayBlocks";
    logging_function_03._M_len = 0xc;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_03._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_03,source_file_03,iVar13,ALL,Error,(ConstevalFormatString<0U>)fmt);
  }
  else {
    logging_function._M_str = "ReplayBlocks";
    logging_function._M_len = 0xc;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x12fb,ALL,Error,(ConstevalFormatString<0U>)0x80f030);
  }
LAB_00400a8a:
  bVar5 = false;
LAB_00400a91:
  if (hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cache.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_00b033f0;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&cache.cacheCoins._M_h);
  if (cache.m_sentinel.second.m_flags != '\0') {
    ((cache.m_sentinel.second.m_next)->second).m_prev = cache.m_sentinel.second.m_prev;
    ((cache.m_sentinel.second.m_prev)->second).m_next = cache.m_sentinel.second.m_next;
    cache.m_sentinel.second.m_flags = '\0';
  }
  if (0x1c < cache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(cache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
         indirect);
    cache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
    indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource(&cache.m_cache_coins_memory_resource);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock36.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool Chainstate::ReplayBlocks()
{
    LOCK(cs_main);

    CCoinsView& db = this->CoinsDB();
    CCoinsViewCache cache(&db);

    std::vector<uint256> hashHeads = db.GetHeadBlocks();
    if (hashHeads.empty()) return true; // We're already in a consistent state.
    if (hashHeads.size() != 2) {
        LogError("ReplayBlocks(): unknown inconsistent state\n");
        return false;
    }

    m_chainman.GetNotifications().progress(_("Replaying blocks…"), 0, false);
    LogPrintf("Replaying blocks\n");

    const CBlockIndex* pindexOld = nullptr;  // Old tip during the interrupted flush.
    const CBlockIndex* pindexNew;            // New tip during the interrupted flush.
    const CBlockIndex* pindexFork = nullptr; // Latest block common to both the old and the new tip.

    if (m_blockman.m_block_index.count(hashHeads[0]) == 0) {
        LogError("ReplayBlocks(): reorganization to unknown block requested\n");
        return false;
    }
    pindexNew = &(m_blockman.m_block_index[hashHeads[0]]);

    if (!hashHeads[1].IsNull()) { // The old tip is allowed to be 0, indicating it's the first flush.
        if (m_blockman.m_block_index.count(hashHeads[1]) == 0) {
            LogError("ReplayBlocks(): reorganization from unknown block requested\n");
            return false;
        }
        pindexOld = &(m_blockman.m_block_index[hashHeads[1]]);
        pindexFork = LastCommonAncestor(pindexOld, pindexNew);
        assert(pindexFork != nullptr);
    }

    // Rollback along the old branch.
    while (pindexOld != pindexFork) {
        if (pindexOld->nHeight > 0) { // Never disconnect the genesis block.
            CBlock block;
            if (!m_blockman.ReadBlockFromDisk(block, *pindexOld)) {
                LogError("RollbackBlock(): ReadBlockFromDisk() failed at %d, hash=%s\n", pindexOld->nHeight, pindexOld->GetBlockHash().ToString());
                return false;
            }
            LogPrintf("Rolling back %s (%i)\n", pindexOld->GetBlockHash().ToString(), pindexOld->nHeight);
            DisconnectResult res = DisconnectBlock(block, pindexOld, cache);
            if (res == DISCONNECT_FAILED) {
                LogError("RollbackBlock(): DisconnectBlock failed at %d, hash=%s\n", pindexOld->nHeight, pindexOld->GetBlockHash().ToString());
                return false;
            }
            // If DISCONNECT_UNCLEAN is returned, it means a non-existing UTXO was deleted, or an existing UTXO was
            // overwritten. It corresponds to cases where the block-to-be-disconnect never had all its operations
            // applied to the UTXO set. However, as both writing a UTXO and deleting a UTXO are idempotent operations,
            // the result is still a version of the UTXO set with the effects of that block undone.
        }
        pindexOld = pindexOld->pprev;
    }

    // Roll forward from the forking point to the new tip.
    int nForkHeight = pindexFork ? pindexFork->nHeight : 0;
    for (int nHeight = nForkHeight + 1; nHeight <= pindexNew->nHeight; ++nHeight) {
        const CBlockIndex& pindex{*Assert(pindexNew->GetAncestor(nHeight))};

        LogPrintf("Rolling forward %s (%i)\n", pindex.GetBlockHash().ToString(), nHeight);
        m_chainman.GetNotifications().progress(_("Replaying blocks…"), (int)((nHeight - nForkHeight) * 100.0 / (pindexNew->nHeight - nForkHeight)), false);
        if (!RollforwardBlock(&pindex, cache)) return false;
    }

    cache.SetBestBlock(pindexNew->GetBlockHash());
    cache.Flush();
    m_chainman.GetNotifications().progress(bilingual_str{}, 100, false);
    return true;
}